

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# residual_functions.h
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
IsobarVLEResiduals<double>::call
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          IsobarVLEResiduals<double> *this,vector<double,_std::allocator<double>_> *rhovec)

{
  MixDerivs<double> *pMVar1;
  _Head_base<0UL,_const_MixDerivs<double>_*,_false> this_00;
  _Head_base<0UL,_const_MixDerivs<double>_*,_false> this_01;
  pointer pdVar2;
  CoolPropBaseError *this_02;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  EigenArray rhovecL;
  EigenArray rhovecV;
  _Any_data local_a8;
  double *local_98;
  long local_90;
  double local_88;
  double local_80;
  double local_78;
  double *local_70;
  long local_68;
  string local_60;
  double local_40;
  double local_38;
  double local_30;
  
  uVar6 = (long)(rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar6 & 8) != 0) {
    __assert_fail("rhovec.size() % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/include/isochoric/residual_functions.h"
                  ,0x7a,
                  "virtual std::vector<TYPE> IsobarVLEResiduals<>::call(const std::vector<TYPE> &) [TYPE = double]"
                 );
  }
  local_60._M_dataplus._M_p = (pointer)0x7ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)uVar6 >> 3,(value_type_conflict1 *)&local_60,
             (allocator_type *)&local_98);
  local_60._M_dataplus._M_p =
       (pointer)(rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)local_60._M_dataplus._M_p >> 3) >>
          1;
  local_60._M_string_length = uVar6;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_98,
             (DenseBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_60);
  local_60._M_dataplus._M_p =
       (pointer)((rhovec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar6);
  local_60._M_string_length = uVar6;
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&local_70,
             (DenseBase<Eigen::Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_60);
  local_60._M_dataplus._M_p = (pointer)this->m_T;
  if ((this->m_factory).super__Function_base._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  else {
    (*(this->m_factory)._M_invoker)
              (&local_a8,(double *)&this->m_factory,(Array<double,__1,_1,_0,__1,_1> *)&local_60);
    uVar3 = local_a8._M_unused._0_8_;
    local_a8._M_unused._M_object = (MixDerivs<double> *)0x0;
    pMVar1 = (this->m_derL)._M_t.
             super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
             .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
    (this->m_derL)._M_t.
    super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>.
    _M_t.
    super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
    .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl =
         (MixDerivs<double> *)uVar3;
    if (pMVar1 != (MixDerivs<double> *)0x0) {
      std::default_delete<const_MixDerivs<double>_>::operator()
                ((default_delete<const_MixDerivs<double>_> *)&this->m_derL,pMVar1);
      if ((MixDerivs<double> *)local_a8._M_unused._0_8_ != (MixDerivs<double> *)0x0) {
        std::default_delete<const_MixDerivs<double>_>::operator()
                  ((default_delete<const_MixDerivs<double>_> *)local_a8._M_pod_data,
                   (MixDerivs<double> *)local_a8._M_unused._0_8_);
      }
    }
    local_60._M_dataplus._M_p = (pointer)this->m_T;
    if ((this->m_factory).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_factory)._M_invoker)
                (&local_a8,(double *)&this->m_factory,(Array<double,__1,_1,_0,__1,_1> *)&local_60);
      uVar3 = local_a8._M_unused._0_8_;
      local_a8._M_unused._M_object = (MixDerivs<double> *)0x0;
      pMVar1 = (this->m_derV)._M_t.
               super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
               .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
      (this->m_derV)._M_t.
      super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
      .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl =
           (MixDerivs<double> *)uVar3;
      if (pMVar1 != (MixDerivs<double> *)0x0) {
        std::default_delete<const_MixDerivs<double>_>::operator()
                  ((default_delete<const_MixDerivs<double>_> *)&this->m_derV,pMVar1);
        if ((MixDerivs<double> *)local_a8._M_unused._0_8_ != (MixDerivs<double> *)0x0) {
          std::default_delete<const_MixDerivs<double>_>::operator()
                    ((default_delete<const_MixDerivs<double>_> *)local_a8._M_pod_data,
                     (MixDerivs<double> *)local_a8._M_unused._0_8_);
        }
      }
      this_00._M_head_impl =
           (this->m_derL)._M_t.
           super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
           .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
      this_01._M_head_impl =
           (this->m_derV)._M_t.
           super___uniq_ptr_impl<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_MixDerivs<double>_*,_std::default_delete<const_MixDerivs<double>_>_>
           .super__Head_base<0UL,_const_MixDerivs<double>_*,_false>._M_head_impl;
      local_a8._8_8_ = (this_00._M_head_impl)->R;
      local_30 = MixDerivs<double>::p(this_00._M_head_impl);
      local_78 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_00._M_head_impl,0);
      local_80 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_00._M_head_impl,1);
      local_38 = MixDerivs<double>::p(this_01._M_head_impl);
      local_88 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_01._M_head_impl,0);
      dVar7 = MixDerivs<double>::dpsir_drhoi__constTrhoj(this_01._M_head_impl,1);
      if ((0 < local_90) && (local_40 = dVar7, 0 < local_68)) {
        local_78 = local_78 - local_88;
        local_88 = this->m_T * (double)local_a8._8_8_;
        dVar7 = log(*local_98 / *local_70);
        *(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start = dVar7 * local_88 + local_78;
        if ((1 < local_90) && (1 < local_68)) {
          local_80 = local_80 - local_40;
          local_a8._8_8_ = (double)local_a8._8_8_ * this->m_T;
          dVar7 = log(local_98[1] / local_70[1]);
          pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar2[1] = dVar7 * (double)local_a8._8_8_ + local_80;
          pdVar2[2] = local_30 - this->m_p;
          pdVar2[3] = local_38 - this->m_p;
          lVar4 = (long)(__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2;
          if (lVar4 != 0) {
            lVar4 = lVar4 >> 3;
            lVar5 = 0;
            do {
              if (1.79769313486232e+308 < ABS(pdVar2[lVar5])) {
                this_02 = (CoolPropBaseError *)__cxa_allocate_exception(0x30);
                local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_60,"Invalid value found","");
                CoolProp::CoolPropBaseError::CoolPropBaseError(this_02,&local_60,eValue);
                *(undefined ***)this_02 = &PTR__CoolPropBaseError_001ac058;
                __cxa_throw(this_02,&CoolProp::
                                     CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::
                                     typeinfo,CoolProp::CoolPropBaseError::~CoolPropBaseError);
              }
              lVar5 = lVar5 + 1;
            } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
          }
          free(local_70);
          free(local_98);
          return __return_storage_ptr__;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/CoolProp/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0xa2,
                    "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Array<double, -1, 1>, Level = 0]"
                   );
    }
  }
  uVar3 = std::__throw_bad_function_call();
  free(local_70);
  free(local_98);
  pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(__return_storage_ptr__->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

std::vector<TYPE> call(const std::vector<TYPE> &rhovec) {
        assert(rhovec.size() % 2 == 0); // Even length
        std::vector<TYPE> y(rhovec.size(), _HUGE);
        std::size_t N = rhovec.size() / 2;
        const EigenArray rhovecL = Eigen::Map<const EigenArray>(&(rhovec[0]), N);
        const EigenArray rhovecV = Eigen::Map<const EigenArray>(&(rhovec[0]) + N, N);

        m_derL = m_factory(m_T, rhovecL);
        m_derV = m_factory(m_T, rhovecV);
        auto &derL = *m_derL, &derV = *m_derV;
        TYPE R = derL.R;

        TYPE pL = derL.p(), chempotr0L = derL.dpsir_drhoi__constTrhoj(0), chempotr1L = derL.dpsir_drhoi__constTrhoj(1);
        TYPE pV = derV.p(), chempotr0V = derV.dpsir_drhoi__constTrhoj(0), chempotr1V = derV.dpsir_drhoi__constTrhoj(1);

        y[0] = chempotr0L - chempotr0V + R*m_T*log(rhovecL[0]/rhovecV[0]);
        y[1] = chempotr1L - chempotr1V + R*m_T*log(rhovecL[1]/rhovecV[1]);
        y[2] = pL - m_p;
        y[3] = pV - m_p;
        for (std::size_t i = 0; i < y.size(); ++i) {
            if (!ValidNumber(y[i])) {
                throw ValueError("Invalid value found");
            }
        }
        return y;
    }